

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasm_cpp.h
# Opt level: O0

void __thiscall
moira::Moira::dasmCmp<(moira::Instr)37,(moira::Mode)10,(moira::Size)1>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  StrWriter *pSVar1;
  ushort in_CX;
  StrWriter *in_RSI;
  Ea<(moira::Mode)10,_(moira::Size)1> *in_RDI;
  Dn dst;
  Ea<(moira::Mode)10,_(moira::Size)1> src;
  undefined4 in_stack_ffffffffffffffc0;
  Align align;
  Dn local_34;
  u32 *in_stack_ffffffffffffffd0;
  u16 in_stack_ffffffffffffffde;
  undefined6 in_stack_ffffffffffffffe0;
  
  Op<(moira::Mode)10,(moira::Size)1>
            ((Moira *)CONCAT26(in_CX,in_stack_ffffffffffffffe0),in_stack_ffffffffffffffde,
             in_stack_ffffffffffffffd0);
  Dn::Dn(&local_34,(int)(uint)in_CX >> 9 & 7);
  pSVar1 = StrWriter::operator<<(in_RSI);
  pSVar1 = StrWriter::operator<<(pSVar1);
  align.raw = in_RDI[1].pc;
  StrWriter::operator<<(pSVar1,align);
  pSVar1 = StrWriter::operator<<((StrWriter *)CONCAT44(align.raw,in_stack_ffffffffffffffc0),in_RDI);
  pSVar1 = StrWriter::operator<<(pSVar1,", ");
  StrWriter::operator<<(pSVar1,local_34);
  return;
}

Assistant:

void
Moira::dasmCmp(StrWriter &str, u32 &addr, u16 op)
{
    Ea<M,S> src = Op <M,S> ( _____________xxx(op), addr );
    Dn      dst = Dn       ( ____xxx_________(op)       );

    str << Ins<I>{} << Sz<S>{} << tab << src << ", " << dst;
}